

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.h
# Opt level: O0

void __thiscall tvm::runtime::NDArray::NDArray(NDArray *this,ObjectPtr<tvm::runtime::Object> *data)

{
  ObjectPtr<tvm::runtime::Object> local_20;
  ObjectPtr<tvm::runtime::Object> *local_18;
  ObjectPtr<tvm::runtime::Object> *data_local;
  NDArray *this_local;
  
  local_18 = data;
  data_local = (ObjectPtr<tvm::runtime::Object> *)this;
  ObjectPtr<tvm::runtime::Object>::ObjectPtr(&local_20,data);
  ObjectRef::ObjectRef(&this->super_ObjectRef,&local_20);
  ObjectPtr<tvm::runtime::Object>::~ObjectPtr(&local_20);
  return;
}

Assistant:

explicit NDArray(ObjectPtr<Object> data)
      : ObjectRef(data) {}